

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O0

void listelem_add_block(listelem_alloc_t *list,char *caller_file,int caller_line)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  glist_t pgVar4;
  int local_48;
  int local_3c;
  long lStack_38;
  int32 blocksize;
  size_t j;
  char *cp;
  char **cpp;
  int caller_line_local;
  char *caller_file_local;
  listelem_alloc_t *list_local;
  
  if (list->blocksize == (glist_t)0x0) {
    local_48 = 0x32;
  }
  else {
    local_48 = (int)(list->blocksize->data).i;
  }
  local_3c = local_48;
  if (list->blk_alloc == 0) {
    local_3c = local_48 << 1;
    if (0x40000 < (long)local_3c * list->elemsize) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = list->elemsize;
      local_3c = SUB164((ZEXT416(0) << 0x40 | ZEXT816(0x40000)) / auVar2,0);
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)local_3c * list->elemsize;
    list->blk_alloc = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40000)) / auVar3,0);
  }
  cp = (char *)__ckd_calloc__((long)local_3c,list->elemsize,caller_file,caller_line);
  list->freelist = (char **)cp;
  pgVar4 = glist_add_ptr(list->blocks,cp);
  list->blocks = pgVar4;
  pgVar4 = glist_add_int32(list->blocksize,local_3c);
  list->blocksize = pgVar4;
  for (lStack_38 = (long)(local_3c + -1); lStack_38 != 0; lStack_38 = lStack_38 + -1) {
    sVar1 = list->elemsize;
    *(char **)cp = cp + sVar1;
    cp = cp + sVar1;
  }
  cp[0] = '\0';
  cp[1] = '\0';
  cp[2] = '\0';
  cp[3] = '\0';
  cp[4] = '\0';
  cp[5] = '\0';
  cp[6] = '\0';
  cp[7] = '\0';
  list->blk_alloc = list->blk_alloc - 1;
  list->n_blocks = list->n_blocks + 1;
  return;
}

Assistant:

static void
listelem_add_block(listelem_alloc_t *list, char *caller_file, int caller_line)
{
    char **cpp, *cp;
    size_t j;
    int32 blocksize;

    blocksize = list->blocksize ? gnode_int32(list->blocksize) : MIN_ALLOC;
    /* Check if block size should be increased (if many requests for this size) */
    if (list->blk_alloc == 0) {
        /* See above.  No sense in allocating blocks bigger than
         * 256KiB (well, actually, there might be, but we'll worry
         * about that later). */
	blocksize <<= 1;
        if (blocksize * list->elemsize > (1 << 18))
            blocksize = (1 << 18) / list->elemsize;
	list->blk_alloc = (1 << 18) / (blocksize * list->elemsize);
    }

    /* Allocate block */
    cpp = list->freelist =
	(char **) __ckd_calloc__(blocksize, list->elemsize,
				 caller_file, caller_line);
    list->blocks = glist_add_ptr(list->blocks, cpp);
    list->blocksize = glist_add_int32(list->blocksize, blocksize);
    cp = (char *) cpp;
    /* Link up the blocks via their first machine word. */
    for (j = blocksize - 1; j > 0; --j) {
	cp += list->elemsize;
	*cpp = cp;
	cpp = (char **) cp;
    }
    /* Make sure the last element's forward pointer is NULL */
    *cpp = NULL;
    --list->blk_alloc;
    ++list->n_blocks;
}